

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

bool __thiscall cmProcess::Buffer::GetLast(Buffer *this,string *line)

{
  bool bVar1;
  char *pcVar2;
  string *line_local;
  Buffer *this_local;
  
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    (&this->super_vector<char,_std::allocator<char>_>);
  if (!bVar1) {
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       (&this->super_vector<char,_std::allocator<char>_>);
    std::vector<char,_std::allocator<char>_>::size(&this->super_vector<char,_std::allocator<char>_>)
    ;
    std::__cxx11::string::assign((char *)line,(ulong)pcVar2);
    this->Last = 0;
    this->First = 0;
    std::vector<char,_std::allocator<char>_>::clear
              (&this->super_vector<char,_std::allocator<char>_>);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool cmProcess::Buffer::GetLast(std::string& line)
{
  // Return the partial last line, if any.
  if (!this->empty()) {
    line.assign(this->data(), this->size());
    this->First = this->Last = 0;
    this->clear();
    return true;
  }
  return false;
}